

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jidctint.c
# Opt level: O0

void jpeg_idct_9x9(j_decompress_ptr cinfo,jpeg_component_info *compptr,JCOEFPTR coef_block,
                  JSAMPARRAY output_buf,JDIMENSION output_col)

{
  JSAMPLE *pJVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  JSAMPROW pJVar15;
  JSAMPLE local_1e8 [4];
  int local_1e4;
  int workspace [72];
  int ctr;
  JSAMPLE *range_limit;
  JSAMPROW outptr;
  int *wsptr;
  ISLOW_MULT_TYPE *quantptr;
  JCOEFPTR inptr;
  INT32 z4;
  INT32 z3;
  INT32 z2;
  INT32 z1;
  INT32 tmp14;
  INT32 tmp13;
  INT32 tmp12;
  INT32 tmp11;
  INT32 tmp10;
  INT32 tmp3;
  INT32 tmp2;
  INT32 tmp1;
  INT32 tmp0;
  JDIMENSION output_col_local;
  JSAMPARRAY output_buf_local;
  JCOEFPTR coef_block_local;
  jpeg_component_info *compptr_local;
  j_decompress_ptr cinfo_local;
  
  pJVar1 = cinfo->sample_range_limit;
  wsptr = (int *)compptr->dct_table;
  outptr = local_1e8;
  quantptr = (ISLOW_MULT_TYPE *)coef_block;
  for (workspace[0x47] = 0; workspace[0x47] < 8; workspace[0x47] = workspace[0x47] + 1) {
    lVar2 = (long)((int)(short)*quantptr * *wsptr) * 0x2000 + 0x400;
    lVar3 = (long)((int)(short)quantptr[8] * wsptr[0x10]);
    lVar4 = (long)((int)(short)quantptr[0x10] * wsptr[0x20]);
    lVar5 = (long)((int)(short)quantptr[0x18] * wsptr[0x30]);
    lVar6 = lVar2 + lVar5 * 0x16a1;
    lVar2 = lVar2 + lVar5 * -0x16a1 + lVar5 * -0x16a1;
    lVar5 = lVar3 - lVar4;
    lVar7 = lVar2 + lVar5 * 0x16a1;
    lVar8 = lVar6 + (lVar3 + lVar4) * 0x2a87 + lVar4 * -0x7dc;
    lVar9 = lVar6 + (lVar3 + lVar4) * -0x2a87 + lVar3 * 0x22ab;
    lVar3 = lVar6 + lVar3 * -0x22ab + lVar4 * 0x7dc;
    lVar4 = (long)((int)(short)quantptr[4] * wsptr[8]);
    lVar6 = (long)((int)(short)quantptr[0xc] * wsptr[0x18]);
    lVar10 = (long)((int)(short)quantptr[0x14] * wsptr[0x28]);
    lVar11 = (long)((int)(short)quantptr[0x1c] * wsptr[0x38]);
    lVar12 = lVar6 * -0x2731;
    lVar13 = (lVar4 + lVar10) * 0x1d17;
    lVar14 = (lVar4 + lVar11) * 0xf7a;
    lVar6 = lVar13 + lVar14 + lVar6 * 0x2731;
    lVar13 = lVar12 + (lVar10 - lVar11) * -0x2c91 + lVar13;
    lVar14 = lVar12 + (lVar10 - lVar11) * 0x2c91 + lVar14;
    lVar11 = (lVar4 - lVar10) - lVar11;
    *(int *)outptr = (int)(lVar8 + lVar6 >> 0xb);
    *(int *)(outptr + 0x100) = (int)(lVar8 - lVar6 >> 0xb);
    *(int *)(outptr + 0x20) = (int)(lVar7 + lVar11 * 0x2731 >> 0xb);
    *(int *)(outptr + 0xe0) = (int)(lVar7 + lVar11 * -0x2731 >> 0xb);
    *(int *)(outptr + 0x40) = (int)(lVar9 + lVar13 >> 0xb);
    *(int *)(outptr + 0xc0) = (int)(lVar9 - lVar13 >> 0xb);
    *(int *)(outptr + 0x60) = (int)(lVar3 + lVar14 >> 0xb);
    *(int *)(outptr + 0xa0) = (int)(lVar3 - lVar14 >> 0xb);
    *(int *)(outptr + 0x80) = (int)(lVar2 + lVar5 * -0x16a1 + lVar5 * -0x16a1 >> 0xb);
    quantptr = (ISLOW_MULT_TYPE *)((long)quantptr + 2);
    wsptr = wsptr + 1;
    outptr = outptr + 4;
  }
  outptr = local_1e8;
  for (workspace[0x47] = 0; workspace[0x47] < 9; workspace[0x47] = workspace[0x47] + 1) {
    pJVar15 = output_buf[workspace[0x47]] + output_col;
    lVar2 = ((long)*(int *)outptr + 0x10) * 0x2000;
    lVar3 = (long)*(int *)(outptr + 8);
    lVar4 = (long)*(int *)(outptr + 0x10);
    lVar5 = (long)*(int *)(outptr + 0x18);
    lVar6 = lVar2 + lVar5 * 0x16a1;
    lVar2 = lVar2 + lVar5 * -0x16a1 + lVar5 * -0x16a1;
    lVar5 = lVar3 - lVar4;
    lVar7 = lVar2 + lVar5 * 0x16a1;
    lVar8 = lVar6 + (lVar3 + lVar4) * 0x2a87 + lVar4 * -0x7dc;
    lVar9 = lVar6 + (lVar3 + lVar4) * -0x2a87 + lVar3 * 0x22ab;
    lVar3 = lVar6 + lVar3 * -0x22ab + lVar4 * 0x7dc;
    lVar4 = (long)*(int *)(outptr + 4);
    lVar6 = (long)*(int *)(outptr + 0x14);
    lVar11 = (long)*(int *)(outptr + 0x1c);
    lVar10 = (long)*(int *)(outptr + 0xc) * -0x2731;
    lVar13 = (lVar4 + lVar6) * 0x1d17;
    lVar14 = (lVar4 + lVar11) * 0xf7a;
    lVar12 = lVar13 + lVar14 + (long)*(int *)(outptr + 0xc) * 0x2731;
    lVar13 = lVar10 + (lVar6 - lVar11) * -0x2c91 + lVar13;
    lVar14 = lVar10 + (lVar6 - lVar11) * 0x2c91 + lVar14;
    lVar11 = (lVar4 - lVar6) - lVar11;
    *pJVar15 = pJVar1[(long)(int)((uint)(lVar8 + lVar12 >> 0x12) & 0x3ff) + 0x80];
    pJVar15[8] = pJVar1[(long)(int)((uint)(lVar8 - lVar12 >> 0x12) & 0x3ff) + 0x80];
    pJVar15[1] = pJVar1[(long)(int)((uint)(lVar7 + lVar11 * 0x2731 >> 0x12) & 0x3ff) + 0x80];
    pJVar15[7] = pJVar1[(long)(int)((uint)(lVar7 + lVar11 * -0x2731 >> 0x12) & 0x3ff) + 0x80];
    pJVar15[2] = pJVar1[(long)(int)((uint)(lVar9 + lVar13 >> 0x12) & 0x3ff) + 0x80];
    pJVar15[6] = pJVar1[(long)(int)((uint)(lVar9 - lVar13 >> 0x12) & 0x3ff) + 0x80];
    pJVar15[3] = pJVar1[(long)(int)((uint)(lVar3 + lVar14 >> 0x12) & 0x3ff) + 0x80];
    pJVar15[5] = pJVar1[(long)(int)((uint)(lVar3 - lVar14 >> 0x12) & 0x3ff) + 0x80];
    pJVar15[4] = pJVar1[(long)(int)((uint)(lVar2 + lVar5 * -0x16a1 + lVar5 * -0x16a1 >> 0x12) &
                                   0x3ff) + 0x80];
    outptr = outptr + 0x20;
  }
  return;
}

Assistant:

GLOBAL(void)
jpeg_idct_9x9 (j_decompress_ptr cinfo, jpeg_component_info * compptr,
	       JCOEFPTR coef_block,
	       JSAMPARRAY output_buf, JDIMENSION output_col)
{
  INT32 tmp0, tmp1, tmp2, tmp3, tmp10, tmp11, tmp12, tmp13, tmp14;
  INT32 z1, z2, z3, z4;
  JCOEFPTR inptr;
  ISLOW_MULT_TYPE * quantptr;
  int * wsptr;
  JSAMPROW outptr;
  JSAMPLE *range_limit = IDCT_range_limit(cinfo);
  int ctr;
  int workspace[8*9];	/* buffers data between passes */
  SHIFT_TEMPS

  /* Pass 1: process columns from input, store into work array. */

  inptr = coef_block;
  quantptr = (ISLOW_MULT_TYPE *) compptr->dct_table;
  wsptr = workspace;
  for (ctr = 0; ctr < 8; ctr++, inptr++, quantptr++, wsptr++) {
    /* Even part */

    tmp0 = DEQUANTIZE(inptr[DCTSIZE*0], quantptr[DCTSIZE*0]);
    tmp0 <<= CONST_BITS;
    /* Add fudge factor here for final descale. */
    tmp0 += ONE << (CONST_BITS-PASS1_BITS-1);

    z1 = DEQUANTIZE(inptr[DCTSIZE*2], quantptr[DCTSIZE*2]);
    z2 = DEQUANTIZE(inptr[DCTSIZE*4], quantptr[DCTSIZE*4]);
    z3 = DEQUANTIZE(inptr[DCTSIZE*6], quantptr[DCTSIZE*6]);

    tmp3 = MULTIPLY(z3, FIX(0.707106781));      /* c6 */
    tmp1 = tmp0 + tmp3;
    tmp2 = tmp0 - tmp3 - tmp3;

    tmp0 = MULTIPLY(z1 - z2, FIX(0.707106781)); /* c6 */
    tmp11 = tmp2 + tmp0;
    tmp14 = tmp2 - tmp0 - tmp0;

    tmp0 = MULTIPLY(z1 + z2, FIX(1.328926049)); /* c2 */
    tmp2 = MULTIPLY(z1, FIX(1.083350441));      /* c4 */
    tmp3 = MULTIPLY(z2, FIX(0.245575608));      /* c8 */

    tmp10 = tmp1 + tmp0 - tmp3;
    tmp12 = tmp1 - tmp0 + tmp2;
    tmp13 = tmp1 - tmp2 + tmp3;

    /* Odd part */

    z1 = DEQUANTIZE(inptr[DCTSIZE*1], quantptr[DCTSIZE*1]);
    z2 = DEQUANTIZE(inptr[DCTSIZE*3], quantptr[DCTSIZE*3]);
    z3 = DEQUANTIZE(inptr[DCTSIZE*5], quantptr[DCTSIZE*5]);
    z4 = DEQUANTIZE(inptr[DCTSIZE*7], quantptr[DCTSIZE*7]);

    z2 = MULTIPLY(z2, - FIX(1.224744871));           /* -c3 */

    tmp2 = MULTIPLY(z1 + z3, FIX(0.909038955));      /* c5 */
    tmp3 = MULTIPLY(z1 + z4, FIX(0.483689525));      /* c7 */
    tmp0 = tmp2 + tmp3 - z2;
    tmp1 = MULTIPLY(z3 - z4, FIX(1.392728481));      /* c1 */
    tmp2 += z2 - tmp1;
    tmp3 += z2 + tmp1;
    tmp1 = MULTIPLY(z1 - z3 - z4, FIX(1.224744871)); /* c3 */

    /* Final output stage */

    wsptr[8*0] = (int) RIGHT_SHIFT(tmp10 + tmp0, CONST_BITS-PASS1_BITS);
    wsptr[8*8] = (int) RIGHT_SHIFT(tmp10 - tmp0, CONST_BITS-PASS1_BITS);
    wsptr[8*1] = (int) RIGHT_SHIFT(tmp11 + tmp1, CONST_BITS-PASS1_BITS);
    wsptr[8*7] = (int) RIGHT_SHIFT(tmp11 - tmp1, CONST_BITS-PASS1_BITS);
    wsptr[8*2] = (int) RIGHT_SHIFT(tmp12 + tmp2, CONST_BITS-PASS1_BITS);
    wsptr[8*6] = (int) RIGHT_SHIFT(tmp12 - tmp2, CONST_BITS-PASS1_BITS);
    wsptr[8*3] = (int) RIGHT_SHIFT(tmp13 + tmp3, CONST_BITS-PASS1_BITS);
    wsptr[8*5] = (int) RIGHT_SHIFT(tmp13 - tmp3, CONST_BITS-PASS1_BITS);
    wsptr[8*4] = (int) RIGHT_SHIFT(tmp14, CONST_BITS-PASS1_BITS);
  }

  /* Pass 2: process 9 rows from work array, store into output array. */

  wsptr = workspace;
  for (ctr = 0; ctr < 9; ctr++) {
    outptr = output_buf[ctr] + output_col;

    /* Even part */

    /* Add fudge factor here for final descale. */
    tmp0 = (INT32) wsptr[0] + (ONE << (PASS1_BITS+2));
    tmp0 <<= CONST_BITS;

    z1 = (INT32) wsptr[2];
    z2 = (INT32) wsptr[4];
    z3 = (INT32) wsptr[6];

    tmp3 = MULTIPLY(z3, FIX(0.707106781));      /* c6 */
    tmp1 = tmp0 + tmp3;
    tmp2 = tmp0 - tmp3 - tmp3;

    tmp0 = MULTIPLY(z1 - z2, FIX(0.707106781)); /* c6 */
    tmp11 = tmp2 + tmp0;
    tmp14 = tmp2 - tmp0 - tmp0;

    tmp0 = MULTIPLY(z1 + z2, FIX(1.328926049)); /* c2 */
    tmp2 = MULTIPLY(z1, FIX(1.083350441));      /* c4 */
    tmp3 = MULTIPLY(z2, FIX(0.245575608));      /* c8 */

    tmp10 = tmp1 + tmp0 - tmp3;
    tmp12 = tmp1 - tmp0 + tmp2;
    tmp13 = tmp1 - tmp2 + tmp3;

    /* Odd part */

    z1 = (INT32) wsptr[1];
    z2 = (INT32) wsptr[3];
    z3 = (INT32) wsptr[5];
    z4 = (INT32) wsptr[7];

    z2 = MULTIPLY(z2, - FIX(1.224744871));           /* -c3 */

    tmp2 = MULTIPLY(z1 + z3, FIX(0.909038955));      /* c5 */
    tmp3 = MULTIPLY(z1 + z4, FIX(0.483689525));      /* c7 */
    tmp0 = tmp2 + tmp3 - z2;
    tmp1 = MULTIPLY(z3 - z4, FIX(1.392728481));      /* c1 */
    tmp2 += z2 - tmp1;
    tmp3 += z2 + tmp1;
    tmp1 = MULTIPLY(z1 - z3 - z4, FIX(1.224744871)); /* c3 */

    /* Final output stage */

    outptr[0] = range_limit[(int) RIGHT_SHIFT(tmp10 + tmp0,
					      CONST_BITS+PASS1_BITS+3)
			    & RANGE_MASK];
    outptr[8] = range_limit[(int) RIGHT_SHIFT(tmp10 - tmp0,
					      CONST_BITS+PASS1_BITS+3)
			    & RANGE_MASK];
    outptr[1] = range_limit[(int) RIGHT_SHIFT(tmp11 + tmp1,
					      CONST_BITS+PASS1_BITS+3)
			    & RANGE_MASK];
    outptr[7] = range_limit[(int) RIGHT_SHIFT(tmp11 - tmp1,
					      CONST_BITS+PASS1_BITS+3)
			    & RANGE_MASK];
    outptr[2] = range_limit[(int) RIGHT_SHIFT(tmp12 + tmp2,
					      CONST_BITS+PASS1_BITS+3)
			    & RANGE_MASK];
    outptr[6] = range_limit[(int) RIGHT_SHIFT(tmp12 - tmp2,
					      CONST_BITS+PASS1_BITS+3)
			    & RANGE_MASK];
    outptr[3] = range_limit[(int) RIGHT_SHIFT(tmp13 + tmp3,
					      CONST_BITS+PASS1_BITS+3)
			    & RANGE_MASK];
    outptr[5] = range_limit[(int) RIGHT_SHIFT(tmp13 - tmp3,
					      CONST_BITS+PASS1_BITS+3)
			    & RANGE_MASK];
    outptr[4] = range_limit[(int) RIGHT_SHIFT(tmp14,
					      CONST_BITS+PASS1_BITS+3)
			    & RANGE_MASK];

    wsptr += 8;		/* advance pointer to next row */
  }
}